

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void enumerate(MAFSA_automaton ma,uint32_t cstate,MAFSA_stack_struct *out_stack,
              MAFSA_automaton_string_handler fetcher,void *user_data)

{
  MAFSA_letter *pMVar1;
  MAFSA_letter l;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  MAFSA_stack_struct *in_RCX;
  MAFSA_stack_struct *in_RDX;
  uint32_t in_ESI;
  long in_RDI;
  MAFSA_automaton_string_handler in_R8;
  uint32_t where;
  uint32_t child;
  uint32_t links_begin;
  uint32_t data;
  MAFSA_automaton_string_handler fetcher_00;
  MAFSA_stack_struct *out_stack_00;
  MAFSA_stack_struct *st;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = node_is_final(in_ESI);
  fetcher_00 = in_R8;
  out_stack_00 = in_RCX;
  if (iVar2 != 0) {
    pMVar1 = in_RDX->buffer;
    sVar4 = stack_size(in_RDX);
    (*(code *)in_RCX)(in_R8,pMVar1,sVar4);
  }
  uVar3 = node_get_children_start(in_ESI);
  data = *(uint32_t *)(*(long *)(in_RDI + 8) + (ulong)uVar3 * 4);
  while( true ) {
    iVar2 = link_is_terminating(data);
    if (iVar2 != 0) break;
    st = in_RDX;
    l = link_get_label(data);
    stack_push(in_RDX,l);
    link_get_link(data);
    enumerate((MAFSA_automaton)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (uint32_t)((ulong)st >> 0x20),out_stack_00,fetcher_00,(void *)CONCAT44(uVar3,data));
    stack_pop(st);
    uVar3 = uVar3 + 1;
    data = *(uint32_t *)(*(long *)(in_RDI + 8) + (ulong)uVar3 * 4);
    in_RDX = st;
  }
  return;
}

Assistant:

static void enumerate(const MAFSA_automaton ma, const uint32_t cstate, struct MAFSA_stack_struct *out_stack,
    MAFSA_automaton_string_handler fetcher, void *user_data)
{
    uint32_t links_begin, child, where;

    if (node_is_final(cstate))
    {
        fetcher(user_data, out_stack->buffer, stack_size(out_stack));
    }

    links_begin = node_get_children_start(cstate);

    for (child = ma->ptr_links[links_begin]; !link_is_terminating(child); child = ma->ptr_links[++links_begin])
    {
        stack_push(out_stack, link_get_label(child));
        where = link_get_link(child);
        enumerate(ma, ma->ptr_nodes[where], out_stack, fetcher, user_data);
        stack_pop(out_stack);
    }
}